

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

bool_t prf_model_append_node(prf_model_t *model,prf_node_t *node)

{
  int iVar1;
  short *in_RSI;
  long *in_RDI;
  bool bVar2;
  int count;
  prf_nodeinfo_t *info;
  prf_node_t *anode;
  uint16_t in_stack_ffffffffffffffce;
  prf_nodeinfo_t *local_28;
  long local_20;
  
  if ((*in_RDI == 0) || (*in_RSI == 1)) {
    if ((*in_RDI != 0) || (*in_RSI != 1)) {
      prf_error(9,"append node - node doesn\'t fit model");
      return 0;
    }
    *in_RDI = (long)in_RSI;
  }
  else {
    local_20 = *in_RDI;
    while (*(long *)(local_20 + 0x10) != 0) {
      iVar1 = prf_array_count((void *)0x109d45);
      if (0 < iVar1) {
        local_20 = *(long *)(*(long *)(local_20 + 0x10) + (long)(iVar1 + -1) * 8);
      }
    }
    local_28 = prf_nodeinfo_get(in_stack_ffffffffffffffce);
    while( true ) {
      bVar2 = false;
      if (local_28 != (prf_nodeinfo_t *)0x0) {
        bVar2 = (local_28->flags & 0x202) != 0;
      }
      if (!bVar2) break;
      local_28 = prf_nodeinfo_get(in_stack_ffffffffffffffce);
    }
  }
  return 1;
}

Assistant:

bool_t
prf_model_append_node(
    prf_model_t * model,
    prf_node_t * node )
{
    assert( model != NULL && node != NULL );

    if ( model->header != NULL && node->opcode != 1 ) {
        prf_node_t * anode;
        prf_nodeinfo_t * info;
        int count;

        anode = model->header;
        while ( anode->children != NULL ) {
            if ( (count = prf_array_count( anode->children )) > 0 )
                anode = anode->children[ count - 1 ];
        }
        info = prf_nodeinfo_get( anode->opcode );
        while ( info != NULL &&
                (info->flags & (PRF_POP_NODE | PRF_ANCILLARY)) != 0 ) {
            anode = anode->parent;
            info = prf_nodeinfo_get( anode->opcode );
        }
    } else if ( model->header == NULL && node->opcode == 1 ) {
        model->header = node;
    } else {
        prf_error( 9, "append node - node doesn't fit model" );
        return FALSE;
    }
    return TRUE;
}